

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

int __thiscall helics::MessageFederateManager::getEndpointCount(MessageFederateManager *this)

{
  shared_mutex *__rwlock;
  int iVar1;
  
  if ((this->mLocalEndpoints).enabled == false) {
    iVar1 = (int)(this->mLocalEndpoints).m_obj.dataStorage.csize;
  }
  else {
    __rwlock = &(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
    iVar1 = (int)(this->mLocalEndpoints).m_obj.dataStorage.csize;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  return iVar1;
}

Assistant:

int MessageFederateManager::getEndpointCount() const
{
    return static_cast<int>(mLocalEndpoints.lock_shared()->size());
}